

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t cfd::core::TxIn::EstimateTxInSize
                   (AddressType addr_type,Script *redeem_script,uint32_t *witness_area_size,
                   uint32_t *no_witness_area_size,Script *scriptsig_template)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t sVar5;
  CfdException *this;
  uint32_t uVar6;
  int iVar7;
  uint32_t local_70;
  allocator local_69;
  uint32_t reqnum;
  uint uStack_64;
  int local_60;
  char *local_58;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_48;
  
  local_70 = 0x4c;
  bVar1 = true;
  bVar2 = false;
  uVar6 = 0;
  switch(addr_type) {
  case kP2pkhAddress:
    uVar4 = 0x96;
    goto LAB_0036e948;
  case kP2wshAddress:
    local_70 = 0x29;
    bVar2 = false;
    break;
  case kP2wpkhAddress:
    uVar4 = 0x29;
    goto LAB_0036e85b;
  case kP2shP2wshAddress:
    break;
  case kP2shP2wpkhAddress:
    uVar4 = 0x40;
LAB_0036e85b:
    uVar6 = 0x6d;
    goto LAB_0036e948;
  case kTaprootAddress:
    local_70 = 0x29;
    bVar2 = true;
    bVar1 = true;
    break;
  default:
    bVar2 = Script::IsEmpty(redeem_script);
    if (bVar2) {
      _reqnum = "cfdcore_transaction.cpp";
      local_60 = 0x6f;
      local_58 = "EstimateTxInSize";
      logger::warn<>((CfdSourceLocation *)&reqnum,"unknown address type, and empty redeem script.");
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&reqnum,"unknown address type, and empty redeem script.",&local_69);
      CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&reqnum);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
  case kP2shAddress:
    bVar2 = false;
    bVar1 = false;
  }
  if ((scriptsig_template == (Script *)0x0) || (bVar3 = Script::IsEmpty(scriptsig_template), bVar3))
  {
    if (bVar2) {
      iVar7 = 0x42;
    }
    else {
      bVar2 = Script::IsEmpty(redeem_script);
      iVar7 = 0x8c;
      if (!bVar2) {
        Script::GetData((ByteData *)&reqnum,redeem_script);
        sVar5 = ByteData::GetSerializeSize((ByteData *)&reqnum);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reqnum);
        _reqnum = (pointer)((ulong)uStack_64 << 0x20);
        ScriptUtil::ExtractPubkeysFromMultisigScript(&local_48,redeem_script,&reqnum);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_48);
        iVar7 = (int)sVar5 + 2 + reqnum * 0x4a;
        if (reqnum == 0) {
          iVar7 = (int)sVar5 + 0x8c;
        }
      }
    }
  }
  else {
    Script::GetData((ByteData *)&reqnum,scriptsig_template);
    sVar5 = ByteData::GetSerializeSize((ByteData *)&reqnum);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reqnum);
    iVar7 = (int)sVar5;
  }
  uVar6 = 0;
  uVar4 = iVar7 + 0x2a;
  if (bVar1) {
    uVar6 = iVar7 + 1;
    uVar4 = local_70;
  }
LAB_0036e948:
  if (witness_area_size != (uint32_t *)0x0) {
    *witness_area_size = uVar6;
  }
  if (no_witness_area_size != (uint32_t *)0x0) {
    *no_witness_area_size = uVar4;
  }
  return uVar4 + uVar6;
}

Assistant:

uint32_t TxIn::EstimateTxInSize(
    AddressType addr_type, Script redeem_script, uint32_t *witness_area_size,
    uint32_t *no_witness_area_size, const Script *scriptsig_template) {
  bool is_pubkey = false;
  bool is_witness = true;
  bool is_taproot = false;
  bool use_unlocking_script = true;
  uint32_t size = kMinimumTxInSize;
  uint32_t witness_size = 0;
  uint32_t script_size = 0;

  switch (addr_type) {
    case AddressType::kP2shAddress:
      is_witness = false;
      break;
    case AddressType::kP2pkhAddress:
      is_pubkey = true;
      is_witness = false;
      break;
    case AddressType::kP2wshAddress:
      use_unlocking_script = false;
      break;
    case AddressType::kP2wpkhAddress:
      is_pubkey = true;
      use_unlocking_script = false;
      break;
    case AddressType::kP2shP2wshAddress:
      break;
    case AddressType::kP2shP2wpkhAddress:
      is_pubkey = true;
      break;
    case AddressType::kTaprootAddress:
      is_taproot = true;
      use_unlocking_script = false;
      break;
    default:
      if (redeem_script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "unknown address type, and empty redeem script.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unknown address type, and empty redeem script.");
      }
      is_witness = false;
      break;
  }

  if (is_pubkey) {
    script_size = Pubkey::kCompressedPubkeySize + EC_SIGNATURE_DER_MAX_LEN + 3;
  } else if (
      (scriptsig_template != nullptr) && (!scriptsig_template->IsEmpty())) {
    script_size = static_cast<uint32_t>(
        scriptsig_template->GetData().GetSerializeSize());
  } else if (is_taproot) {
    // signature(64byte) + sighash type(1byte) + serialized(1byte)
    script_size = SchnorrSignature::kSchnorrSignatureSize + 2;
  } else {
    // Forehead is a big size
    script_size = (EC_SIGNATURE_DER_MAX_LEN - 2) * 2;
    if (!redeem_script.IsEmpty()) {
      size_t redeem_script_size = redeem_script.GetData().GetSerializeSize();
      script_size += static_cast<uint32_t>(redeem_script_size);
      try {
        // OP_0 <sig1> <sig2> ... <unlocking script>
        uint32_t reqnum = 0;
        ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script, &reqnum);
        if (reqnum != 0) {
          // set multisig size
          script_size = static_cast<uint32_t>(redeem_script_size);
          script_size += (EC_SIGNATURE_DER_MAX_LEN + 2) * reqnum;
          script_size += 2;  // for top OP_0 size
        }
      } catch (const CfdException &except) {
        if (except.GetErrorCode() != CfdError::kCfdIllegalArgumentError) {
          // error occurs other than multisig confirmation
          throw except;
        }
      }
    }
  }

  if (is_witness) {
    witness_size = script_size + 1;  // witness stack count area(1byte)
    if (!use_unlocking_script) {
      // do nothing
    } else if (is_pubkey) {
      size += 23;  // wpkh locking script length + serialize size(1byte)
    } else {
      size += 35;  // wsh locking script length + serialize size(1byte)
    }
  } else {
    size += script_size + 1;  // serialize size(1byte)
  }
  if (witness_area_size != nullptr) {
    *witness_area_size = static_cast<uint32_t>(witness_size);
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = static_cast<uint32_t>(size);
  }
  size += witness_size;
  return static_cast<uint32_t>(size);
}